

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_AABBTree.cpp
# Opt level: O3

void __thiscall Opcode::AABBTreeNode::~AABBTreeNode(AABBTreeNode *this)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  
  uVar3 = this->mPos & 0xfffffffffffffffe;
  if (uVar3 != 0 && (this->mPos & 1) == 0) {
    lVar1 = *(long *)(uVar3 - 8);
    if (lVar1 != 0) {
      lVar2 = lVar1 * 0x30;
      do {
        ~AABBTreeNode((AABBTreeNode *)((uVar3 - 0x30) + lVar2));
        lVar2 = lVar2 + -0x30;
      } while (lVar2 != 0);
    }
    operator_delete__((void *)(uVar3 - 8),lVar1 * 0x30 + 8);
  }
  this->mNodePrimitives = (udword *)0x0;
  this->mNbPrimitives = 0;
  return;
}

Assistant:

AABBTreeNode::~AABBTreeNode()
{
	// Opcode 1.3:
	const AABBTreeNode* Pos = GetPos();
	const AABBTreeNode* Neg = GetNeg();
#ifndef OPC_NO_NEG_VANILLA_TREE
	if(!(mPos&1))	DELETESINGLE(Pos);
	if(!(mNeg&1))	DELETESINGLE(Neg);
#else
	if(!(mPos&1))	DELETEARRAY(Pos);
#endif
	mNodePrimitives	= null;	// This was just a shortcut to the global list => no release
	mNbPrimitives	= 0;
}